

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O0

void * SPRKStepCreate(ARKRhsFn f1,ARKRhsFn f2,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  int iVar1;
  uint uVar2;
  N_Vector tmpl;
  long in_RCX;
  N_Vector in_RDX;
  ARKodeMem in_RSI;
  N_Vector_Ops in_RDI;
  sunrealtype in_XMM0_Qa;
  int retval;
  ARKodeSPRKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  int init_type;
  ARKodeMem local_8;
  
  uVar3 = 0;
  if (in_RDI == (N_Vector_Ops)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x2e,"SPRKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Must specify at least one of fe, fi (both NULL).");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RSI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x35,"SPRKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Must specify at least one of fe, fi (both NULL).");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RDX == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x3d,"SPRKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"y0 = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RCX == 0) {
    arkProcessError((ARKodeMem)0x0,-0x16,0x44,"SPRKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"sunctx = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else {
    local_8 = arkCreate((SUNContext_conflict)0x0);
    init_type = (int)((ulong)in_RCX >> 0x20);
    if (local_8 == (ARKodeMem)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x15,0x4d,"SPRKStepCreate",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                      ,"arkode_mem = NULL illegal.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      tmpl = (N_Vector)malloc(0x48);
      if (tmpl == (N_Vector)0x0) {
        arkProcessError(local_8,-0x14,0x57,"SPRKStepCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                        ,"Allocation of arkode_mem failed.");
        local_8 = (ARKodeMem)0x0;
      }
      else {
        memset(tmpl,0,0x48);
        iVar1 = arkAllocVec(local_8,tmpl,(N_Vector *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
        if (iVar1 == 0) {
          ARKodeFree(&tmpl->content);
          local_8 = (ARKodeMem)0x0;
        }
        else {
          if (local_8->use_compensated_sums == 0) {
            tmpl[1].content = (void *)0x0;
          }
          else {
            iVar1 = arkAllocVec(local_8,tmpl,(N_Vector *)CONCAT44(uVar3,in_stack_ffffffffffffffb8));
            if (iVar1 == 0) {
              ARKodeFree(&tmpl->content);
              return (void *)0x0;
            }
            N_VConst(0,tmpl[1].content);
          }
          local_8->step_init = sprkStep_Init;
          local_8->step_fullrhs = sprkStep_FullRHS;
          local_8->step = sprkStep_TakeStep;
          local_8->step_printallstats = sprkStep_PrintAllStats;
          local_8->step_writeparameters = sprkStep_WriteParameters;
          local_8->step_resize = sprkStep_Resize;
          local_8->step_free = sprkStep_Free;
          local_8->step_setdefaults = sprkStep_SetDefaults;
          local_8->step_setorder = sprkStep_SetOrder;
          local_8->step_getnumrhsevals = sprkStep_GetNumRhsEvals;
          local_8->step_mem = tmpl;
          uVar2 = sprkStep_SetDefaults((ARKodeMem)0x198212);
          if (uVar2 == 0) {
            tmpl[1].ops = in_RDI;
            tmpl[1].sunctx = (SUNContext_conflict)in_RSI;
            tmpl[2].content = (void *)0x0;
            tmpl[2].ops = (N_Vector_Ops)0x0;
            *(undefined4 *)&tmpl[2].sunctx = 0;
            ARKodeSetInterpolantType(local_8,(int)((ulong)tmpl >> 0x20));
            uVar2 = arkInit(in_RSI,in_XMM0_Qa,in_RDX,init_type);
            if (uVar2 != 0) {
              arkProcessError(local_8,(int)(ulong)uVar2,0x96,"SPRKStepCreate",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                              ,"Unable to initialize main ARKODE infrastructure");
              ARKodeFree(&tmpl->content);
              local_8 = (ARKodeMem)0x0;
            }
          }
          else {
            arkProcessError(local_8,(int)(ulong)uVar2,0x7f,"SPRKStepCreate",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep.c"
                            ,"Error setting default solver options");
            ARKodeFree(&tmpl->content);
            local_8 = (ARKodeMem)0x0;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* SPRKStepCreate(ARKRhsFn f1, ARKRhsFn f2, sunrealtype t0, N_Vector y0,
                     SUNContext sunctx)
{
  ARKodeMem ark_mem          = NULL;
  ARKodeSPRKStepMem step_mem = NULL;
  int retval                 = 0;

  /* Check that f1 and f2 are supplied */
  if (!f1)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  if (!f2)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (!y0)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeSPRKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeSPRKStepMem)malloc(sizeof(struct ARKodeSPRKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeSPRKStepMemRec));

  /* Allocate vectors in stepper mem */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  if (ark_mem->use_compensated_sums)
  {
    if (!arkAllocVec(ark_mem, y0, &(step_mem->yerr)))
    {
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    /* Zero yerr for compensated summation */
    N_VConst(ZERO, step_mem->yerr);
  }
  else { step_mem->yerr = NULL; }
  ark_mem->step_init            = sprkStep_Init;
  ark_mem->step_fullrhs         = sprkStep_FullRHS;
  ark_mem->step                 = sprkStep_TakeStep;
  ark_mem->step_printallstats   = sprkStep_PrintAllStats;
  ark_mem->step_writeparameters = sprkStep_WriteParameters;
  ark_mem->step_resize          = sprkStep_Resize;
  ark_mem->step_free            = sprkStep_Free;
  ark_mem->step_setdefaults     = sprkStep_SetDefaults;
  ark_mem->step_setorder        = sprkStep_SetOrder;
  ark_mem->step_getnumrhsevals  = sprkStep_GetNumRhsEvals;
  ark_mem->step_mem             = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = sprkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->f1 = f1;
  step_mem->f2 = f2;

  /* Initialize the counters */
  step_mem->nf1    = 0;
  step_mem->nf2    = 0;
  step_mem->istage = 0;

  /* SPRKStep uses Lagrange interpolation by default, since Hermite is
     less compatible with these methods. */
  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}